

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_CalcHeight(player_t *player)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  float local_44;
  byte local_31;
  double defaultviewheight;
  double dStack_20;
  bool still;
  double bob;
  DAngle angle;
  player_t *player_local;
  
  angle.Degrees = (double)player;
  TAngle<double>::TAngle((TAngle<double> *)&bob);
  defaultviewheight._7_1_ = 0;
  if ((*(uint *)((long)angle.Degrees + 0xe8) & 0x40000000) == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)&defaultviewheight,
               (int)*(undefined8 *)angle.Degrees +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&defaultviewheight);
    local_31 = 0;
    if (uVar1 != 0) {
      local_31 = *(byte *)((long)angle.Degrees + 0x170) ^ 0xff;
    }
    if ((local_31 & 1) == 0) {
      dVar2 = TVector2<double>::LengthSquared((TVector2<double> *)((long)angle.Degrees + 0x80));
      *(double *)((long)angle.Degrees + 0x78) = dVar2;
      if ((*(double *)((long)angle.Degrees + 0x78) != 0.0) ||
         (NAN(*(double *)((long)angle.Degrees + 0x78)))) {
        dVar2 = userinfo_t::GetMoveBob((userinfo_t *)((long)angle.Degrees + 0x38));
        *(double *)((long)angle.Degrees + 0x78) = dVar2 * *(double *)((long)angle.Degrees + 0x78);
        if (16.0 < *(double *)((long)angle.Degrees + 0x78)) {
          *(undefined8 *)((long)angle.Degrees + 0x78) = 0x4030000000000000;
        }
      }
      else {
        defaultviewheight._7_1_ = 1;
      }
    }
    else {
      *(undefined8 *)((long)angle.Degrees + 0x78) = 0x3fe0000000000000;
    }
  }
  else {
    *(undefined8 *)((long)angle.Degrees + 0x78) = 0;
  }
  dVar2 = *(double *)(*(long *)angle.Degrees + 0x4e0) + *(double *)((long)angle.Degrees + 0x1d8);
  if ((*(uint *)((long)angle.Degrees + 0xe8) & 4) == 0) {
    if ((defaultviewheight._7_1_ & 1) == 0) {
      TAngle<double>::operator=((TAngle<double> *)&bob,((double)level.time / 20.0) * 360.0);
      dVar3 = *(double *)((long)angle.Degrees + 0x78);
      dVar4 = TAngle<double>::Sin((TAngle<double> *)&bob);
      local_44 = 0.25;
      if (*(int *)(*(long *)angle.Degrees + 0x2a0) < 2) {
        local_44 = 0.5;
      }
      dStack_20 = dVar3 * dVar4 * (double)local_44;
    }
    else if (*(int *)((long)angle.Degrees + 0x98) < 1) {
      dStack_20 = 0.0;
    }
    else {
      TAngle<double>::operator=((TAngle<double> *)&bob,((double)level.time / 120.0) * 360.0);
      dVar3 = userinfo_t::GetStillBob((userinfo_t *)((long)angle.Degrees + 0x38));
      dStack_20 = TAngle<double>::Sin((TAngle<double> *)&bob);
      dStack_20 = dVar3 * dStack_20;
    }
    if (*(char *)((long)angle.Degrees + 8) == '\0') {
      *(double *)((long)angle.Degrees + 0x68) =
           *(double *)((long)angle.Degrees + 0x70) + *(double *)((long)angle.Degrees + 0x68);
      if (*(double *)((long)angle.Degrees + 0x68) <= dVar2) {
        if ((*(double *)((long)angle.Degrees + 0x68) < dVar2 / 2.0) &&
           (*(double *)((long)angle.Degrees + 0x68) = dVar2 / 2.0,
           *(double *)((long)angle.Degrees + 0x70) <= 0.0)) {
          *(undefined8 *)((long)angle.Degrees + 0x70) = 0x3ef0000000000000;
        }
      }
      else {
        *(double *)((long)angle.Degrees + 0x68) = dVar2;
        *(undefined8 *)((long)angle.Degrees + 0x70) = 0;
      }
      if ((*(double *)((long)angle.Degrees + 0x70) != 0.0) ||
         (NAN(*(double *)((long)angle.Degrees + 0x70)))) {
        *(double *)((long)angle.Degrees + 0x70) = *(double *)((long)angle.Degrees + 0x70) + 0.25;
        if ((*(double *)((long)angle.Degrees + 0x70) == 0.0) &&
           (!NAN(*(double *)((long)angle.Degrees + 0x70)))) {
          *(undefined8 *)((long)angle.Degrees + 0x70) = 0x3ef0000000000000;
        }
      }
    }
    if (*(int *)((long)angle.Degrees + 0x140) != 0) {
      dStack_20 = 0.0;
    }
    dVar2 = AActor::Z(*(AActor **)angle.Degrees);
    *(double *)((long)angle.Degrees + 0x60) =
         dVar2 + *(double *)((long)angle.Degrees + 0x68) + dStack_20;
    if ((((*(double *)(*(long *)angle.Degrees + 600) != 0.0) ||
         (NAN(*(double *)(*(long *)angle.Degrees + 600)))) &&
        (*(char *)((long)angle.Degrees + 8) != '\x01')) &&
       (dVar2 = AActor::Z(*(AActor **)angle.Degrees),
       dVar2 <= *(double *)(*(long *)angle.Degrees + 0x120))) {
      *(double *)((long)angle.Degrees + 0x60) =
           *(double *)((long)angle.Degrees + 0x60) - *(double *)(*(long *)angle.Degrees + 600);
    }
    if (*(double *)(*(long *)angle.Degrees + 0x128) - 4.0 < *(double *)((long)angle.Degrees + 0x60))
    {
      *(double *)((long)angle.Degrees + 0x60) = *(double *)(*(long *)angle.Degrees + 0x128) - 4.0;
    }
    if (*(double *)((long)angle.Degrees + 0x60) < *(double *)(*(long *)angle.Degrees + 0x120) + 4.0)
    {
      *(double *)((long)angle.Degrees + 0x60) = *(double *)(*(long *)angle.Degrees + 0x120) + 4.0;
    }
  }
  else {
    dVar3 = AActor::Z(*(AActor **)angle.Degrees);
    *(double *)((long)angle.Degrees + 0x60) = dVar3 + dVar2;
    if (*(double *)(*(long *)angle.Degrees + 0x128) - 4.0 < *(double *)((long)angle.Degrees + 0x60))
    {
      *(double *)((long)angle.Degrees + 0x60) = *(double *)(*(long *)angle.Degrees + 0x128) - 4.0;
    }
  }
  return;
}

Assistant:

void P_CalcHeight (player_t *player) 
{
	DAngle		angle;
	double	 	bob;
	bool		still = false;

	// Regular movement bobbing
	// (needs to be calculated for gun swing even if not on ground)

	// killough 10/98: Make bobbing depend only on player-applied motion.
	//
	// Note: don't reduce bobbing here if on ice: if you reduce bobbing here,
	// it causes bobbing jerkiness when the player moves from ice to non-ice,
	// and vice-versa.

	if (player->cheats & CF_NOCLIP2)
	{
		player->bob = 0;
	}
	else if ((player->mo->flags & MF_NOGRAVITY) && !player->onground)
	{
		player->bob = 0.5;
	}
	else
	{
		player->bob = player->Vel.LengthSquared();
		if (player->bob == 0)
		{
			still = true;
		}
		else
		{
			player->bob *= player->userinfo.GetMoveBob();

			if (player->bob > MAXBOB)
				player->bob = MAXBOB;
		}
	}

	double defaultviewheight = player->mo->ViewHeight + player->crouchviewdelta;

	if (player->cheats & CF_NOVELOCITY)
	{
		player->viewz = player->mo->Z() + defaultviewheight;

		if (player->viewz > player->mo->ceilingz-4)
			player->viewz = player->mo->ceilingz-4;

		return;
	}

	if (still)
	{
		if (player->health > 0)
		{
			angle = level.time / (120 * TICRATE / 35.) * 360.;
			bob = player->userinfo.GetStillBob() * angle.Sin();
		}
		else
		{
			bob = 0;
		}
	}
	else
	{
		angle = level.time / (20 * TICRATE / 35.) * 360.;
		bob = player->bob * angle.Sin() * (player->mo->waterlevel > 1 ? 0.25f : 0.5f);
	}

	// move viewheight
	if (player->playerstate == PST_LIVE)
	{
		player->viewheight += player->deltaviewheight;

		if (player->viewheight > defaultviewheight)
		{
			player->viewheight = defaultviewheight;
			player->deltaviewheight = 0;
		}
		else if (player->viewheight < (defaultviewheight/2))
		{
			player->viewheight = defaultviewheight/2;
			if (player->deltaviewheight <= 0)
				player->deltaviewheight = 1 / 65536.;
		}
		
		if (player->deltaviewheight)	
		{
			player->deltaviewheight += 0.25;
			if (!player->deltaviewheight)
				player->deltaviewheight = 1/65536.;
		}
	}

	if (player->morphTics)
	{
		bob = 0;
	}
	player->viewz = player->mo->Z() + player->viewheight + bob;
	if (player->mo->Floorclip && player->playerstate != PST_DEAD
		&& player->mo->Z() <= player->mo->floorz)
	{
		player->viewz -= player->mo->Floorclip;
	}
	if (player->viewz > player->mo->ceilingz - 4)
	{
		player->viewz = player->mo->ceilingz - 4;
	}
	if (player->viewz < player->mo->floorz + 4)
	{
		player->viewz = player->mo->floorz + 4;
	}
}